

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3BtreeOpen(sqlite3_vfs *pVfs,char *zFilename,sqlite3 *db,Btree **ppBtree,int flags,
                    int vfsFlags)

{
  char cVar1;
  PCache *pPVar2;
  sqlite3_file *psVar3;
  sqlite3_io_methods *psVar4;
  long lVar5;
  bool bVar6;
  byte bVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  Btree *p;
  BtShared *__s;
  Btree *pBVar14;
  size_t sVar15;
  size_t sVar16;
  size_t sVar17;
  Btree *pBVar18;
  void *pvVar19;
  long lVar20;
  Pager *pPVar21;
  sqlite3_mutex *psVar22;
  sqlite3_mutex *psVar23;
  Btree **ppBVar24;
  code *pcVar25;
  long lVar26;
  Btree *pBVar27;
  int iVar28;
  char *pcVar29;
  u8 uVar30;
  uint uVar31;
  u64 n;
  char *__s_00;
  ulong uVar32;
  byte bVar33;
  uint uVar34;
  long in_FS_OFFSET;
  bool bVar35;
  uchar zDbHeader [100];
  sqlite3_mutex *local_138;
  Pager *local_128;
  char *local_108;
  u8 local_c8;
  uint local_ac;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  ulong local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined4 local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (zFilename == (char *)0x0) {
    bVar35 = true;
LAB_00126569:
    if ((!bVar35) || (bVar7 = 1, db->temp_store != '\x02')) {
      bVar7 = (byte)vfsFlags >> 7;
    }
  }
  else {
    bVar35 = *zFilename == '\0';
    iVar8 = strcmp(zFilename,":memory:");
    if (iVar8 != 0) goto LAB_00126569;
    bVar7 = 1;
  }
  uVar13 = flags | 2;
  if (bVar7 == 0) {
    uVar13 = flags;
  }
  uVar34 = vfsFlags & 0xfffffcffU | 0x200;
  if (bVar7 == 0 && !bVar35) {
    uVar34 = vfsFlags;
  }
  if ((vfsFlags & 0x100U) == 0) {
    uVar34 = vfsFlags;
  }
  p = (Btree *)sqlite3Malloc(0x48);
  if (p == (Btree *)0x0) {
    iVar8 = 7;
    goto LAB_00126be3;
  }
  p->db = (sqlite3 *)0x0;
  p->pBt = (BtShared *)0x0;
  (p->lock).pBtree = (Btree *)0x0;
  (p->lock).iTable = 0;
  (p->lock).eLock = '\0';
  *(undefined3 *)&(p->lock).field_0xd = 0;
  p->pNext = (Btree *)0x0;
  p->pPrev = (Btree *)0x0;
  p->inTrans = '\0';
  p->sharable = '\0';
  p->locked = '\0';
  p->hasIncrblobCur = '\0';
  p->wantToLock = 0;
  p->nBackup = 0;
  p->iDataVersion = 0;
  (p->lock).pNext = (BtLock *)0x0;
  p->db = db;
  (p->lock).pBtree = p;
  (p->lock).iTable = 1;
  if ((!bVar35) && ((uVar34 >> 0x11 & 1) != 0 && ((uVar34 & 0x40) == 0 & bVar7) == 0)) {
    if (zFilename == (char *)0x0) {
      sVar15 = 1;
    }
    else {
      sVar15 = strlen(zFilename);
      sVar15 = (size_t)(((uint)sVar15 & 0x3fffffff) + 1);
    }
    uVar9 = pVfs->mxPathname + 1;
    sVar16 = sVar15;
    if ((int)sVar15 < (int)uVar9) {
      sVar16 = (size_t)uVar9;
    }
    pBVar14 = (Btree *)sqlite3Malloc(sVar16);
    p->sharable = '\x01';
    if (pBVar14 != (Btree *)0x0) {
      if (bVar7 == 0) {
        *(undefined1 *)&pBVar14->db = 0;
        iVar8 = (*pVfs->xFullPathname)(pVfs,zFilename,uVar9,(char *)pBVar14);
        if (iVar8 != 0) {
          sqlite3_free(pBVar14);
          bVar35 = false;
          local_138 = (sqlite3_mutex *)0x0;
          __s = (BtShared *)0x0;
          pBVar14 = p;
          iVar10 = iVar8;
          goto LAB_00126954;
        }
      }
      else {
        memcpy(pBVar14,zFilename,sVar15);
      }
      if (sqlite3Config.bCoreMutex == 0) {
        local_138 = (sqlite3_mutex *)0x0;
      }
      else {
        local_138 = (*sqlite3Config.mutex.xMutexAlloc)(4);
      }
      if (local_138 != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexEnter)(local_138);
      }
      if (sqlite3Config.bCoreMutex == 0) {
        psVar22 = (sqlite3_mutex *)0x0;
      }
      else {
        psVar22 = (*sqlite3Config.mutex.xMutexAlloc)(2);
      }
      __s = sqlite3SharedCacheList;
      if (psVar22 != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexEnter)(psVar22);
        __s = sqlite3SharedCacheList;
      }
      for (; __s != (BtShared *)0x0; __s = __s->pNext) {
        pPVar21 = __s->pPager;
        iVar8 = strcmp((char *)pBVar14,pPVar21->zFilename);
        if ((iVar8 == 0) && (pPVar21->pVfs == pVfs)) {
          lVar26 = (long)db->nDb;
          bVar35 = lVar26 < 1;
          if (lVar26 < 1) goto LAB_00126c57;
          ppBVar24 = &db->aDb[lVar26 + -1].pBt;
          lVar26 = lVar26 + 1;
          goto LAB_00126c34;
        }
      }
      goto LAB_00126938;
    }
    iVar8 = 7;
    bVar35 = false;
    iVar10 = 0;
    local_138 = (sqlite3_mutex *)0x0;
    __s = (BtShared *)0x0;
    pBVar14 = p;
    goto LAB_00126954;
  }
  iVar10 = 0;
  local_138 = (sqlite3_mutex *)0x0;
  __s = (BtShared *)0x0;
  goto LAB_0012662e;
LAB_00126688:
  do {
    pBVar18 = pBVar14;
    pBVar14 = pBVar18->pPrev;
  } while (pBVar18->pPrev != (Btree *)0x0);
  if (p->pBt < pBVar18->pBt) {
    p->pNext = pBVar18;
    ppBVar24 = &pBVar18->pPrev;
    p->pPrev = (Btree *)0x0;
  }
  else {
    do {
      pBVar14 = pBVar18;
      pBVar18 = pBVar14->pNext;
      if (pBVar18 == (Btree *)0x0) {
        p->pNext = (Btree *)0x0;
        pBVar18 = p;
        pBVar27 = pBVar14;
        goto LAB_00126b2e;
      }
    } while (pBVar18->pBt < p->pBt);
    p->pNext = pBVar18;
    p->pPrev = pBVar14;
    pBVar27 = p;
    if (pBVar18 != (Btree *)0x0) {
LAB_00126b2e:
      pBVar18->pPrev = pBVar27;
    }
    ppBVar24 = &pBVar14->pNext;
  }
  *ppBVar24 = p;
  goto LAB_00126b39;
  while( true ) {
    lVar20 = lVar26 + -1;
    ppBVar24 = ppBVar24 + -4;
    lVar5 = lVar26 + -3;
    bVar35 = lVar20 < 2;
    lVar26 = lVar20;
    if (SBORROW8(lVar20,2) != lVar5 < 0) break;
LAB_00126c34:
    if ((*ppBVar24 != (Btree *)0x0) && ((*ppBVar24)->pBt == __s)) {
      if (psVar22 != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexLeave)(psVar22);
      }
      if (local_138 != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexLeave)(local_138);
      }
      sqlite3_free(pBVar14);
      sqlite3_free(p);
      goto LAB_00126ef0;
    }
  }
LAB_00126c57:
  p->pBt = __s;
  __s->nRef = __s->nRef + 1;
LAB_00126ef0:
  if (bVar35) {
LAB_00126938:
    iVar8 = 0x13;
    bVar35 = true;
    iVar10 = 0;
    if (psVar22 != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(psVar22);
    }
LAB_00126954:
    sqlite3_free(pBVar14);
  }
  else {
    iVar8 = 0x13;
    bVar35 = false;
    iVar10 = 0;
  }
  if (!bVar35) goto LAB_00126be3;
LAB_0012662e:
  if (__s == (BtShared *)0x0) {
    __s = (BtShared *)sqlite3Malloc(0x88);
    if (__s == (BtShared *)0x0) {
      iVar10 = 7;
      __s = (BtShared *)0x0;
    }
    else {
      memset(__s,0,0x88);
      local_a8 = CONCAT44(local_a8._4_4_,0x1000);
      iVar8 = 0x58;
      if (0x58 < pVfs->szOsFile) {
        iVar8 = pVfs->szOsFile;
      }
      __s->pPager = (Pager *)0x0;
      uVar9 = uVar13 & 2;
      if (uVar9 == 0) {
        uVar30 = '\0';
LAB_00126777:
        local_c8 = uVar30;
        local_128 = (Pager *)0x0;
        uVar31 = 0;
        __s_00 = zFilename;
LAB_00126981:
        if ((__s_00 == (char *)0x0) || (*__s_00 == '\0')) {
          iVar11 = 0;
          local_108 = (char *)0x0;
          iVar28 = 0;
        }
        else {
          uVar31 = pVfs->mxPathname + 1;
          local_128 = (Pager *)sqlite3Malloc((long)pVfs->mxPathname * 2 + 2);
          iVar11 = 0;
          if (local_128 == (Pager *)0x0) {
            iVar10 = 7;
            local_108 = (char *)0x0;
            iVar28 = 0;
            bVar35 = false;
          }
          else {
            *(char *)&local_128->pVfs = '\0';
            iVar10 = (*pVfs->xFullPathname)(pVfs,__s_00,uVar31,(char *)local_128);
            sVar15 = strlen((char *)local_128);
            sVar16 = strlen(__s_00);
            local_108 = __s_00 + (ulong)((uint)sVar16 & 0x3fffffff) + 1;
            cVar1 = *local_108;
            pcVar29 = local_108;
            while (cVar1 != '\0') {
              sVar16 = strlen(pcVar29);
              sVar17 = strlen(pcVar29 + (sVar16 & 0x3fffffff) + 1);
              pcVar29 = pcVar29 + (sVar17 & 0x3fffffff) + (sVar16 & 0x3fffffff) + 2;
              cVar1 = *pcVar29;
            }
            uVar31 = (uint)sVar15 & 0x3fffffff;
            if ((iVar10 == 0) && (iVar10 = 0, pVfs->mxPathname < (int)(uVar31 + 8))) {
              iVar10 = 0xe;
              sqlite3_log(0xe,"%s at line %d of [%.10s]","cannot open file",0xcbc8,
                          "8d3a7ea6c5690d6b7c3767558f4f01b511c55463e3f9e64506801fe9b74dce34");
            }
            iVar28 = ((int)pcVar29 - (int)local_108) + 1;
            if (iVar10 == 0) {
              bVar35 = true;
            }
            else {
              sqlite3_free(local_128);
              bVar35 = false;
              iVar11 = iVar10;
            }
          }
          if (!bVar35) goto LAB_0012711c;
        }
        sVar15 = (size_t)(int)uVar31;
        uVar32 = (ulong)(iVar8 + 7U & 0x7ffffff8);
        n = ((long)pVfs->szOsFile + 7U & 0xfffffffffffffff8) +
            sVar15 * 3 + uVar32 * 2 + (long)iVar28 + 0x189;
        pPVar21 = (Pager *)sqlite3Malloc(n);
        if (pPVar21 == (Pager *)0x0) {
          iVar10 = 7;
          if (local_128 == (Pager *)0x0) goto LAB_0012711c;
        }
        else {
          memset(pPVar21,0,n);
          pPVar21->pPCache = (PCache *)(pPVar21 + 1);
          pPVar21->fd = (sqlite3_file *)&pPVar21[1].fd;
          pcVar29 = pPVar21[1].dbFileVers +
                    (((long)pVfs->szOsFile + 7U & 0xfffffffffffffff8) - 0x40);
          pPVar21->sjfd = (sqlite3_file *)pcVar29;
          pPVar21->jfd = (sqlite3_file *)(pcVar29 + uVar32);
          pcVar29 = pcVar29 + uVar32 + uVar32;
          pPVar21->zFilename = pcVar29;
          if (local_128 != (Pager *)0x0) {
            pPVar21->zJournal = pcVar29 + (int)(iVar28 + uVar31 + 1);
            memcpy(pcVar29,local_128,sVar15);
            if (iVar28 != 0) {
              memcpy(pPVar21->zFilename + (int)(uVar31 + 1),local_108,(long)iVar28);
            }
            memcpy(pPVar21->zJournal,local_128,sVar15);
            builtin_strncpy(pPVar21->zJournal + sVar15,"-journal",9);
            (pPVar21->zJournal + sVar15 + 8)[1] = '\0';
            pPVar21->zWal = pPVar21->zJournal + sVar15 + 9;
            memcpy(pPVar21->zJournal + sVar15 + 9,local_128,sVar15);
            builtin_strncpy(pPVar21->zWal + sVar15,"-wal",5);
            sqlite3_free(local_128);
          }
          pPVar21->pVfs = pVfs;
          pPVar21->vfsFlags = uVar34;
          if ((__s_00 == (char *)0x0) || (*__s_00 == '\0')) {
LAB_00126f54:
            pPVar21->eState = '\x01';
            pPVar21->eLock = '\x04';
            pPVar21->noLock = '\x01';
            bVar33 = (byte)uVar34 & 1;
            uVar30 = '\x01';
            bVar35 = false;
            iVar10 = iVar11;
          }
          else {
            local_ac = 0;
            iVar11 = (*pVfs->xOpen)(pVfs,pPVar21->zFilename,pPVar21->fd,uVar34 & 0x87f7f,
                                    (int *)&local_ac);
            uVar31 = local_ac & 1;
            bVar33 = (byte)uVar31;
            bVar35 = true;
            if (iVar11 == 0) {
              uVar12 = (*pPVar21->fd->pMethods->xDeviceCharacteristics)(pPVar21->fd);
              if (uVar31 == 0) {
                setSectorSize(pPVar21);
                uVar31 = pPVar21->sectorSize;
                if ((uint)local_a8 < uVar31) {
                  if (uVar31 < 0x2001) {
                    local_a8 = CONCAT44(local_a8._4_4_,uVar31);
                  }
                  else {
                    local_a8 = CONCAT44(local_a8._4_4_,0x2000);
                  }
                }
              }
              iVar8 = sqlite3_uri_boolean(__s_00,"nolock",0);
              pPVar21->noLock = (u8)iVar8;
              if ((uVar12 >> 0xd & 1) == 0) {
                iVar8 = sqlite3_uri_boolean(__s_00,"immutable",0);
                bVar6 = true;
                if (iVar8 == 0) goto LAB_00126f4c;
              }
              uVar34 = 1;
              bVar6 = false;
            }
            else {
              bVar6 = true;
            }
LAB_00126f4c:
            if (!bVar6) goto LAB_00126f54;
            uVar30 = '\0';
            iVar10 = iVar11;
          }
          if (iVar10 == 0) {
            iVar10 = sqlite3PagerSetPagesize(pPVar21,(u32 *)&local_a8,-1);
          }
          if (iVar10 == 0) {
            pcVar25 = (_func_int_void_ptr_PgHdr_ptr *)0x0;
            if (uVar9 == 0) {
              pcVar25 = pagerStress;
            }
            pPVar2 = pPVar21->pPCache;
            pPVar2->szSpill = 0;
            pPVar2->szPage = 0;
            pPVar2->szExtra = 0;
            pPVar2->bPurgeable = '\0';
            pPVar2->eCreate = '\0';
            *(undefined2 *)&pPVar2->field_0x2e = 0;
            pPVar2->xStress = (_func_int_void_ptr_PgHdr_ptr *)0x0;
            pPVar2->pStress = (void *)0x0;
            pPVar2->pSynced = (PgHdr *)0x0;
            pPVar2->nRefSum = 0;
            pPVar2->szCache = 0;
            pPVar2->pDirty = (PgHdr *)0x0;
            pPVar2->pDirtyTail = (PgHdr *)0x0;
            pPVar2->pCache = (sqlite3_pcache *)0x0;
            pPVar2->szExtra = 0x88;
            pPVar2->bPurgeable = (byte)(uVar9 >> 1) ^ 1;
            pPVar2->eCreate = '\x02';
            pPVar2->xStress = pcVar25;
            pPVar2->pStress = pPVar21;
            pPVar2->szCache = 100;
            pPVar2->szSpill = 1;
            pPVar2->szPage = 1;
            iVar10 = sqlite3PcacheSetPageSize(pPVar2,(uint)local_a8);
          }
          if (iVar10 == 0) {
            pPVar21->useJournal = (byte)(uVar13 & 1) ^ 1;
            pPVar21->mxPgno = 0x3fffffff;
            pPVar21->tempFile = uVar30;
            pPVar21->exclusiveMode = uVar30;
            pPVar21->changeCountDone = uVar30;
            pPVar21->memDb = local_c8;
            pPVar21->readOnly = bVar33;
            pPVar21->noSync = uVar30;
            if (bVar35) {
              pPVar21->fullSync = '\x01';
              pPVar21->extraSync = '\0';
              pPVar21->ckptSyncFlags = '\x02';
              pPVar21->walSyncFlags = '\"';
              pPVar21->syncFlags = '\x02';
            }
            pPVar21->nExtra = 0x88;
            pPVar21->journalSizeLimit = -1;
            setSectorSize(pPVar21);
            if ((uVar13 & 3) != 0) {
              pPVar21->journalMode = ((uVar13 & 1) == 0) * '\x02' + '\x02';
            }
            pPVar21->xReiniter = pageReinit;
            if (pPVar21->errCode == 0) {
              if (pPVar21->bUseFetch == '\0') {
                pcVar25 = getPageNormal;
              }
              else {
                pcVar25 = getPageMMap;
              }
            }
            else {
              pcVar25 = getPageError;
            }
            pPVar21->xGet = pcVar25;
            __s->pPager = pPVar21;
            iVar10 = 0;
            goto LAB_0012711c;
          }
          psVar3 = pPVar21->fd;
          if (psVar3->pMethods != (sqlite3_io_methods *)0x0) {
            (*psVar3->pMethods->xClose)(psVar3);
            psVar3->pMethods = (sqlite3_io_methods *)0x0;
          }
          pcache1Free(pPVar21->pTmpSpace);
          local_128 = pPVar21;
        }
        sqlite3_free(local_128);
      }
      else {
        local_c8 = '\x01';
        if (zFilename == (char *)0x0) {
          local_128 = (Pager *)0x0;
          uVar31 = 0;
          __s_00 = (char *)0x0;
          goto LAB_00126981;
        }
        uVar30 = '\x01';
        if (*zFilename == '\0') goto LAB_00126777;
        local_128 = (Pager *)sqlite3DbStrDup((sqlite3 *)0x0,zFilename);
        if (local_128 != (Pager *)0x0) {
          sVar15 = strlen((char *)local_128);
          uVar31 = (uint)sVar15 & 0x3fffffff;
          __s_00 = (char *)0x0;
          goto LAB_00126981;
        }
        iVar10 = 7;
      }
LAB_0012711c:
      if (iVar10 == 0) {
        pPVar21 = __s->pPager;
        pPVar21->szMmap = db->szMmap;
        pagerFixMaplimit(pPVar21);
        local_58 = 0;
        uStack_50 = 0;
        local_68 = 0;
        uStack_60 = 0;
        local_78 = 0;
        uStack_70 = 0;
        local_88 = 0;
        uStack_80 = 0;
        local_98 = 0;
        uStack_90 = 0;
        local_a8 = 0;
        uStack_a0 = 0;
        local_48 = 0;
        psVar3 = __s->pPager->fd;
        psVar4 = psVar3->pMethods;
        if (psVar4 == (sqlite3_io_methods *)0x0) {
          iVar10 = 0;
        }
        else {
          iVar10 = (*psVar4->xRead)(psVar3,&local_a8,100,0);
          if (iVar10 == 0x20a) {
            iVar10 = 0;
          }
        }
      }
      if (iVar10 == 0) {
        __s->openFlags = (u8)uVar13;
        __s->db = db;
        pPVar21 = __s->pPager;
        pPVar21->xBusyHandler = btreeInvokeBusyHandler;
        pPVar21->pBusyHandlerArg = __s;
        psVar4 = pPVar21->fd->pMethods;
        if (psVar4 != (sqlite3_io_methods *)0x0) {
          (*psVar4->xFileControl)(pPVar21->fd,0xf,&pPVar21->xBusyHandler);
        }
        p->pBt = __s;
        __s->pCursor = (BtCursor *)0x0;
        __s->pPage1 = (MemPage *)0x0;
        if (__s->pPager->readOnly != '\0') {
          *(byte *)&__s->btsFlags = (byte)__s->btsFlags | 1;
        }
        iVar8 = (int)((local_98 & 0xff) << 8);
        uVar13 = (uint)local_98._1_1_ * 0x10000 + iVar8;
        __s->pageSize = uVar13;
        if (((iVar8 + (uint)local_98._1_1_ * 0x10000) - 0x10001 < 0xffff01ff) ||
           ((uVar13 + 0x1ffff & uVar13) != 0)) {
          __s->pageSize = 0;
          uVar13 = 0;
          if (zFilename != (char *)0x0 && bVar7 == 0) {
            __s->autoVacuum = '\0';
            __s->incrVacuum = '\0';
            uVar13 = 0;
          }
        }
        else {
          uVar13 = (uint)local_98._4_1_;
          __s->btsFlags = __s->btsFlags | 2;
          __s->autoVacuum =
               ((local_78._4_4_ >> 0x18 != 0 || (local_78 & 0xff000000000000) != 0) ||
               (local_78 & 0xff0000000000) != 0) || (local_78 & 0xff00000000) != 0;
          __s->incrVacuum =
               (((uint)local_68 >> 0x18 != 0 || (local_68 & 0xff0000) != 0) ||
               (local_68 & 0xff00) != 0) || (local_68 & 0xff) != 0;
        }
        iVar10 = sqlite3PagerSetPagesize(__s->pPager,&__s->pageSize,uVar13);
        if (iVar10 == 0) {
          __s->usableSize = __s->pageSize - uVar13;
          __s->nRef = 1;
          if (p->sharable == '\0') {
            iVar10 = 0;
            goto LAB_0012663f;
          }
          if (sqlite3Config.bCoreMutex == 0) {
            psVar22 = (sqlite3_mutex *)0x0;
          }
          else {
            psVar22 = (*sqlite3Config.mutex.xMutexAlloc)(2);
          }
          if (sqlite3Config.bCoreMutex == 0) {
LAB_0012732a:
            if (psVar22 == (sqlite3_mutex *)0x0) {
              __s->pNext = sqlite3SharedCacheList;
              sqlite3SharedCacheList = __s;
            }
            else {
              (*sqlite3Config.mutex.xMutexEnter)(psVar22);
              __s->pNext = sqlite3SharedCacheList;
              sqlite3SharedCacheList = __s;
              (*sqlite3Config.mutex.xMutexLeave)(psVar22);
            }
            iVar10 = 0;
            bVar35 = true;
          }
          else {
            bVar35 = false;
            psVar23 = (*sqlite3Config.mutex.xMutexAlloc)(0);
            __s->mutex = psVar23;
            if (psVar23 != (sqlite3_mutex *)0x0) goto LAB_0012732a;
            iVar10 = 7;
          }
          if (bVar35) goto LAB_0012663f;
        }
      }
    }
  }
  else {
LAB_0012663f:
    if ((p->sharable != '\0') && (0 < (long)db->nDb)) {
      lVar26 = 0;
      do {
        pBVar14 = *(Btree **)((long)&db->aDb->pBt + lVar26);
        if ((pBVar14 != (Btree *)0x0) && (pBVar14->sharable != '\0')) goto LAB_00126688;
        lVar26 = lVar26 + 0x20;
      } while ((long)db->nDb * 0x20 != lVar26);
    }
LAB_00126b39:
    *ppBtree = p;
  }
  if (iVar10 == 0) {
    pvVar19 = sqlite3BtreeSchema(p,0,(_func_void_void_ptr *)0x0);
    if (pvVar19 == (void *)0x0) {
      pPVar2 = p->pBt->pPager->pPCache;
      pPVar2->szCache = -2000;
      (*sqlite3Config.pcache2.xCachesize)
                (pPVar2->pCache,
                 SUB164((ZEXT816(0) << 0x40 | ZEXT816(0x1f4000)) /
                        SEXT816((long)pPVar2->szExtra + (long)pPVar2->szPage),0));
    }
    psVar3 = __s->pPager->fd;
    psVar4 = psVar3->pMethods;
    if (psVar4 != (sqlite3_io_methods *)0x0) {
      (*psVar4->xFileControl)(psVar3,0x1e,&__s->db);
    }
  }
  else {
    if ((__s != (BtShared *)0x0) && (__s->pPager != (Pager *)0x0)) {
      sqlite3PagerClose(__s->pPager,(sqlite3 *)0x0);
    }
    sqlite3_free(__s);
    sqlite3_free(p);
    *ppBtree = (Btree *)0x0;
  }
  iVar8 = iVar10;
  if (local_138 != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(local_138);
  }
LAB_00126be3:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar8;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeOpen(
  sqlite3_vfs *pVfs,      /* VFS to use for this b-tree */
  const char *zFilename,  /* Name of the file containing the BTree database */
  sqlite3 *db,            /* Associated database handle */
  Btree **ppBtree,        /* Pointer to new Btree object written here */
  int flags,              /* Options */
  int vfsFlags            /* Flags passed through to sqlite3_vfs.xOpen() */
){
  BtShared *pBt = 0;             /* Shared part of btree structure */
  Btree *p;                      /* Handle to return */
  sqlite3_mutex *mutexOpen = 0;  /* Prevents a race condition. Ticket #3537 */
  int rc = SQLITE_OK;            /* Result code from this function */
  u8 nReserve;                   /* Byte of unused space on each page */
  unsigned char zDbHeader[100];  /* Database header content */

  /* True if opening an ephemeral, temporary database */
  const int isTempDb = zFilename==0 || zFilename[0]==0;

  /* Set the variable isMemdb to true for an in-memory database, or 
  ** false for a file-based database.
  */
#ifdef SQLITE_OMIT_MEMORYDB
  const int isMemdb = 0;
#else
  const int isMemdb = (zFilename && strcmp(zFilename, ":memory:")==0)
                       || (isTempDb && sqlite3TempInMemory(db))
                       || (vfsFlags & SQLITE_OPEN_MEMORY)!=0;
#endif

  assert( db!=0 );
  assert( pVfs!=0 );
  assert( sqlite3_mutex_held(db->mutex) );
  assert( (flags&0xff)==flags );   /* flags fit in 8 bits */

  /* Only a BTREE_SINGLE database can be BTREE_UNORDERED */
  assert( (flags & BTREE_UNORDERED)==0 || (flags & BTREE_SINGLE)!=0 );

  /* A BTREE_SINGLE database is always a temporary and/or ephemeral */
  assert( (flags & BTREE_SINGLE)==0 || isTempDb );

  if( isMemdb ){
    flags |= BTREE_MEMORY;
  }
  if( (vfsFlags & SQLITE_OPEN_MAIN_DB)!=0 && (isMemdb || isTempDb) ){
    vfsFlags = (vfsFlags & ~SQLITE_OPEN_MAIN_DB) | SQLITE_OPEN_TEMP_DB;
  }
  p = sqlite3MallocZero(sizeof(Btree));
  if( !p ){
    return SQLITE_NOMEM_BKPT;
  }
  p->inTrans = TRANS_NONE;
  p->db = db;
#ifndef SQLITE_OMIT_SHARED_CACHE
  p->lock.pBtree = p;
  p->lock.iTable = 1;
#endif

#if !defined(SQLITE_OMIT_SHARED_CACHE) && !defined(SQLITE_OMIT_DISKIO)
  /*
  ** If this Btree is a candidate for shared cache, try to find an
  ** existing BtShared object that we can share with
  */
  if( isTempDb==0 && (isMemdb==0 || (vfsFlags&SQLITE_OPEN_URI)!=0) ){
    if( vfsFlags & SQLITE_OPEN_SHAREDCACHE ){
      int nFilename = sqlite3Strlen30(zFilename)+1;
      int nFullPathname = pVfs->mxPathname+1;
      char *zFullPathname = sqlite3Malloc(MAX(nFullPathname,nFilename));
      MUTEX_LOGIC( sqlite3_mutex *mutexShared; )

      p->sharable = 1;
      if( !zFullPathname ){
        sqlite3_free(p);
        return SQLITE_NOMEM_BKPT;
      }
      if( isMemdb ){
        memcpy(zFullPathname, zFilename, nFilename);
      }else{
        rc = sqlite3OsFullPathname(pVfs, zFilename,
                                   nFullPathname, zFullPathname);
        if( rc ){
          sqlite3_free(zFullPathname);
          sqlite3_free(p);
          return rc;
        }
      }
#if SQLITE_THREADSAFE
      mutexOpen = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_OPEN);
      sqlite3_mutex_enter(mutexOpen);
      mutexShared = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_MASTER);
      sqlite3_mutex_enter(mutexShared);
#endif
      for(pBt=GLOBAL(BtShared*,sqlite3SharedCacheList); pBt; pBt=pBt->pNext){
        assert( pBt->nRef>0 );
        if( 0==strcmp(zFullPathname, sqlite3PagerFilename(pBt->pPager, 0))
                 && sqlite3PagerVfs(pBt->pPager)==pVfs ){
          int iDb;
          for(iDb=db->nDb-1; iDb>=0; iDb--){
            Btree *pExisting = db->aDb[iDb].pBt;
            if( pExisting && pExisting->pBt==pBt ){
              sqlite3_mutex_leave(mutexShared);
              sqlite3_mutex_leave(mutexOpen);
              sqlite3_free(zFullPathname);
              sqlite3_free(p);
              return SQLITE_CONSTRAINT;
            }
          }
          p->pBt = pBt;
          pBt->nRef++;
          break;
        }
      }
      sqlite3_mutex_leave(mutexShared);
      sqlite3_free(zFullPathname);
    }
#ifdef SQLITE_DEBUG
    else{
      /* In debug mode, we mark all persistent databases as sharable
      ** even when they are not.  This exercises the locking code and
      ** gives more opportunity for asserts(sqlite3_mutex_held())
      ** statements to find locking problems.
      */
      p->sharable = 1;
    }
#endif
  }
#endif
  if( pBt==0 ){
    /*
    ** The following asserts make sure that structures used by the btree are
    ** the right size.  This is to guard against size changes that result
    ** when compiling on a different architecture.
    */
    assert( sizeof(i64)==8 );
    assert( sizeof(u64)==8 );
    assert( sizeof(u32)==4 );
    assert( sizeof(u16)==2 );
    assert( sizeof(Pgno)==4 );
  
    pBt = sqlite3MallocZero( sizeof(*pBt) );
    if( pBt==0 ){
      rc = SQLITE_NOMEM_BKPT;
      goto btree_open_out;
    }
    rc = sqlite3PagerOpen(pVfs, &pBt->pPager, zFilename,
                          sizeof(MemPage), flags, vfsFlags, pageReinit);
    if( rc==SQLITE_OK ){
      sqlite3PagerSetMmapLimit(pBt->pPager, db->szMmap);
      rc = sqlite3PagerReadFileheader(pBt->pPager,sizeof(zDbHeader),zDbHeader);
    }
    if( rc!=SQLITE_OK ){
      goto btree_open_out;
    }
    pBt->openFlags = (u8)flags;
    pBt->db = db;
    sqlite3PagerSetBusyhandler(pBt->pPager, btreeInvokeBusyHandler, pBt);
    p->pBt = pBt;
  
    pBt->pCursor = 0;
    pBt->pPage1 = 0;
    if( sqlite3PagerIsreadonly(pBt->pPager) ) pBt->btsFlags |= BTS_READ_ONLY;
#if defined(SQLITE_SECURE_DELETE)
    pBt->btsFlags |= BTS_SECURE_DELETE;
#elif defined(SQLITE_FAST_SECURE_DELETE)
    pBt->btsFlags |= BTS_OVERWRITE;
#endif
    /* EVIDENCE-OF: R-51873-39618 The page size for a database file is
    ** determined by the 2-byte integer located at an offset of 16 bytes from
    ** the beginning of the database file. */
    pBt->pageSize = (zDbHeader[16]<<8) | (zDbHeader[17]<<16);
    if( pBt->pageSize<512 || pBt->pageSize>SQLITE_MAX_PAGE_SIZE
         || ((pBt->pageSize-1)&pBt->pageSize)!=0 ){
      pBt->pageSize = 0;
#ifndef SQLITE_OMIT_AUTOVACUUM
      /* If the magic name ":memory:" will create an in-memory database, then
      ** leave the autoVacuum mode at 0 (do not auto-vacuum), even if
      ** SQLITE_DEFAULT_AUTOVACUUM is true. On the other hand, if
      ** SQLITE_OMIT_MEMORYDB has been defined, then ":memory:" is just a
      ** regular file-name. In this case the auto-vacuum applies as per normal.
      */
      if( zFilename && !isMemdb ){
        pBt->autoVacuum = (SQLITE_DEFAULT_AUTOVACUUM ? 1 : 0);
        pBt->incrVacuum = (SQLITE_DEFAULT_AUTOVACUUM==2 ? 1 : 0);
      }
#endif
      nReserve = 0;
    }else{
      /* EVIDENCE-OF: R-37497-42412 The size of the reserved region is
      ** determined by the one-byte unsigned integer found at an offset of 20
      ** into the database file header. */
      nReserve = zDbHeader[20];
      pBt->btsFlags |= BTS_PAGESIZE_FIXED;
#ifndef SQLITE_OMIT_AUTOVACUUM
      pBt->autoVacuum = (get4byte(&zDbHeader[36 + 4*4])?1:0);
      pBt->incrVacuum = (get4byte(&zDbHeader[36 + 7*4])?1:0);
#endif
    }
    rc = sqlite3PagerSetPagesize(pBt->pPager, &pBt->pageSize, nReserve);
    if( rc ) goto btree_open_out;
    pBt->usableSize = pBt->pageSize - nReserve;
    assert( (pBt->pageSize & 7)==0 );  /* 8-byte alignment of pageSize */
   
#if !defined(SQLITE_OMIT_SHARED_CACHE) && !defined(SQLITE_OMIT_DISKIO)
    /* Add the new BtShared object to the linked list sharable BtShareds.
    */
    pBt->nRef = 1;
    if( p->sharable ){
      MUTEX_LOGIC( sqlite3_mutex *mutexShared; )
      MUTEX_LOGIC( mutexShared = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_MASTER);)
      if( SQLITE_THREADSAFE && sqlite3GlobalConfig.bCoreMutex ){
        pBt->mutex = sqlite3MutexAlloc(SQLITE_MUTEX_FAST);
        if( pBt->mutex==0 ){
          rc = SQLITE_NOMEM_BKPT;
          goto btree_open_out;
        }
      }
      sqlite3_mutex_enter(mutexShared);
      pBt->pNext = GLOBAL(BtShared*,sqlite3SharedCacheList);
      GLOBAL(BtShared*,sqlite3SharedCacheList) = pBt;
      sqlite3_mutex_leave(mutexShared);
    }
#endif
  }

#if !defined(SQLITE_OMIT_SHARED_CACHE) && !defined(SQLITE_OMIT_DISKIO)
  /* If the new Btree uses a sharable pBtShared, then link the new
  ** Btree into the list of all sharable Btrees for the same connection.
  ** The list is kept in ascending order by pBt address.
  */
  if( p->sharable ){
    int i;
    Btree *pSib;
    for(i=0; i<db->nDb; i++){
      if( (pSib = db->aDb[i].pBt)!=0 && pSib->sharable ){
        while( pSib->pPrev ){ pSib = pSib->pPrev; }
        if( (uptr)p->pBt<(uptr)pSib->pBt ){
          p->pNext = pSib;
          p->pPrev = 0;
          pSib->pPrev = p;
        }else{
          while( pSib->pNext && (uptr)pSib->pNext->pBt<(uptr)p->pBt ){
            pSib = pSib->pNext;
          }
          p->pNext = pSib->pNext;
          p->pPrev = pSib;
          if( p->pNext ){
            p->pNext->pPrev = p;
          }
          pSib->pNext = p;
        }
        break;
      }
    }
  }
#endif
  *ppBtree = p;

btree_open_out:
  if( rc!=SQLITE_OK ){
    if( pBt && pBt->pPager ){
      sqlite3PagerClose(pBt->pPager, 0);
    }
    sqlite3_free(pBt);
    sqlite3_free(p);
    *ppBtree = 0;
  }else{
    sqlite3_file *pFile;

    /* If the B-Tree was successfully opened, set the pager-cache size to the
    ** default value. Except, when opening on an existing shared pager-cache,
    ** do not change the pager-cache size.
    */
    if( sqlite3BtreeSchema(p, 0, 0)==0 ){
      sqlite3PagerSetCachesize(p->pBt->pPager, SQLITE_DEFAULT_CACHE_SIZE);
    }

    pFile = sqlite3PagerFile(pBt->pPager);
    if( pFile->pMethods ){
      sqlite3OsFileControlHint(pFile, SQLITE_FCNTL_PDB, (void*)&pBt->db);
    }
  }
  if( mutexOpen ){
    assert( sqlite3_mutex_held(mutexOpen) );
    sqlite3_mutex_leave(mutexOpen);
  }
  assert( rc!=SQLITE_OK || sqlite3BtreeConnectionCount(*ppBtree)>0 );
  return rc;
}